

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

idx_t duckdb::GetFileUrlOffset(string *path)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  idx_t iStack_60;
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)path);
  ::std::__cxx11::string::string((string *)&local_50,"file:/",&local_51);
  bVar2 = StringUtil::StartsWith(&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  if (bVar2) {
    pcVar1 = (path->_M_dataplus)._M_p;
    if (pcVar1[6] == '/') {
      if (pcVar1[7] == '/') {
        iStack_60 = 7;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((ulong)path,7,(char *)0xa);
        iStack_60 = (ulong)(iVar3 == 0) << 4;
      }
    }
    else {
      iStack_60 = 5;
    }
  }
  else {
    iStack_60 = 0;
  }
  return iStack_60;
}

Assistant:

static idx_t GetFileUrlOffset(const string &path) {
	if (!StringUtil::StartsWith(path, "file:/")) {
		return 0;
	}

	// Url without host: file:/some/path
	if (path[6] != '/') {
#ifdef _WIN32
		return 6;
#else
		return 5;
#endif
	}

	// Url with empty host: file:///some/path
	if (path[7] == '/') {
#ifdef _WIN32
		return 8;
#else
		return 7;
#endif
	}

	// Url with localhost: file://localhost/some/path
	if (path.compare(7, 10, "localhost/") == 0) {
#ifdef _WIN32
		return 17;
#else
		return 16;
#endif
	}

	// unkown file:/ url format
	return 0;
}